

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner-unix.c
# Opt level: O0

long process_output_size(process_info_t *p)

{
  int iVar1;
  undefined1 local_a8 [4];
  int r;
  stat buf;
  process_info_t *p_local;
  
  buf.__glibc_reserved[2] = (__syscall_slong_t)p;
  iVar1 = fileno((FILE *)p->stdout_file);
  iVar1 = fstat64(iVar1,(stat64 *)local_a8);
  if (iVar1 < 0) {
    p_local = (process_info_t *)0xffffffffffffffff;
  }
  else {
    p_local = (process_info_t *)buf.st_rdev;
  }
  return (long)p_local;
}

Assistant:

long int process_output_size(process_info_t *p) {
  /* Size of the p->stdout_file */
  struct stat buf;

  int r = fstat(fileno(p->stdout_file), &buf);
  if (r < 0) {
    return -1;
  }

  return (long)buf.st_size;
}